

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::roundToIntegral(IEEEFloat *this,roundingMode rounding_mode)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint64_t uVar5;
  undefined1 local_48 [3];
  bool inputSign;
  IEEEFloat MagicConstant;
  APInt IntegerConstant;
  opStatus fs;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  
  bVar2 = isFiniteNonZero(this);
  if ((bVar2) &&
     (sVar1 = this->exponent, uVar4 = APFloatBase::semanticsPrecision(this->semantics),
     (int)uVar4 <= sVar1 + 1)) {
    this_local._4_4_ = opOK;
  }
  else {
    uVar4 = APFloatBase::semanticsPrecision(this->semantics);
    uVar5 = NextPowerOf2((ulong)uVar4);
    APInt::APInt((APInt *)&MagicConstant.exponent,(uint)uVar5,1,false);
    uVar4 = APFloatBase::semanticsPrecision(this->semantics);
    APInt::operator<<=((APInt *)&MagicConstant.exponent,uVar4 - 1);
    IEEEFloat((IEEEFloat *)local_48,this->semantics);
    this_local._4_4_ =
         convertFromAPInt((IEEEFloat *)local_48,(APInt *)&MagicConstant.exponent,false,
                          rmNearestTiesToEven);
    MagicConstant.significand.part._2_1_ =
         MagicConstant.significand.part._2_1_ & 0xf7 | ((byte)this->field_0x12 >> 3 & 1) << 3;
    if (this_local._4_4_ == opOK) {
      bVar2 = isNegative(this);
      this_local._4_4_ = add(this,(IEEEFloat *)local_48,rounding_mode);
      if ((this_local._4_4_ == opOK) || (this_local._4_4_ == opInexact)) {
        this_local._4_4_ = subtract(this,(IEEEFloat *)local_48,rounding_mode);
        bVar3 = isNegative(this);
        if (bVar2 != bVar3) {
          changeSign(this);
        }
      }
    }
    ~IEEEFloat((IEEEFloat *)local_48);
    APInt::~APInt((APInt *)&MagicConstant.exponent);
  }
  return this_local._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::roundToIntegral(roundingMode rounding_mode) {
  opStatus fs;

  // If the exponent is large enough, we know that this value is already
  // integral, and the arithmetic below would potentially cause it to saturate
  // to +/-Inf.  Bail out early instead.
  if (isFiniteNonZero() && exponent+1 >= (int)semanticsPrecision(*semantics))
    return opOK;

  // The algorithm here is quite simple: we add 2^(p-1), where p is the
  // precision of our format, and then subtract it back off again.  The choice
  // of rounding modes for the addition/subtraction determines the rounding mode
  // for our integral rounding as well.
  // NOTE: When the input value is negative, we do subtraction followed by
  // addition instead.
  APInt IntegerConstant(NextPowerOf2(semanticsPrecision(*semantics)), 1);
  IntegerConstant <<= semanticsPrecision(*semantics)-1;
  IEEEFloat MagicConstant(*semantics);
  fs = MagicConstant.convertFromAPInt(IntegerConstant, false,
                                      rmNearestTiesToEven);
  MagicConstant.sign = sign;

  if (fs != opOK)
    return fs;

  // Preserve the input sign so that we can handle 0.0/-0.0 cases correctly.
  bool inputSign = isNegative();

  fs = add(MagicConstant, rounding_mode);
  if (fs != opOK && fs != opInexact)
    return fs;

  fs = subtract(MagicConstant, rounding_mode);

  // Restore the input sign.
  if (inputSign != isNegative())
    changeSign();

  return fs;
}